

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiReturn __thiscall Assimp::Importer::UnregisterLoader(Importer *this,BaseImporter *pImp)

{
  ImporterPimpl *pIVar1;
  bool bVar2;
  Logger *pLVar3;
  const_iterator local_58;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_50 [3];
  BaseImporter **local_38;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_30;
  __normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
  local_28;
  iterator it;
  BaseImporter *pImp_local;
  Importer *this_local;
  
  if (pImp == (BaseImporter *)0x0) {
    this_local._4_4_ = aiReturn_SUCCESS;
  }
  else {
    it._M_current = (BaseImporter **)pImp;
    local_30._M_current =
         (BaseImporter **)
         std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::begin
                   (&this->pimpl->mImporter);
    local_38 = (BaseImporter **)
               std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::end
                         (&this->pimpl->mImporter);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<Assimp::BaseImporter**,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>,Assimp::BaseImporter*>
                         (local_30,(__normal_iterator<Assimp::BaseImporter_**,_std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>_>
                                    )local_38,(BaseImporter **)&it);
    local_50[0]._M_current =
         (BaseImporter **)
         std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::end
                   (&this->pimpl->mImporter);
    bVar2 = __gnu_cxx::operator!=(&local_28,local_50);
    if (bVar2) {
      pIVar1 = this->pimpl;
      __gnu_cxx::
      __normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
      ::__normal_iterator<Assimp::BaseImporter**>
                ((__normal_iterator<Assimp::BaseImporter*const*,std::vector<Assimp::BaseImporter*,std::allocator<Assimp::BaseImporter*>>>
                  *)&local_58,&local_28);
      std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::erase
                (&pIVar1->mImporter,local_58);
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"Unregistering custom importer: ");
      this_local._4_4_ = aiReturn_SUCCESS;
    }
    else {
      pLVar3 = DefaultLogger::get();
      Logger::warn(pLVar3,"Unable to remove custom importer: I can\'t find you ...");
      this_local._4_4_ = aiReturn_FAILURE;
    }
  }
  return this_local._4_4_;
}

Assistant:

aiReturn Importer::UnregisterLoader(BaseImporter* pImp)
{
    if(!pImp) {
        // unregistering a NULL importer is no problem for us ... really!
        return AI_SUCCESS;
    }

    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::vector<BaseImporter*>::iterator it = std::find(pimpl->mImporter.begin(),
        pimpl->mImporter.end(),pImp);

    if (it != pimpl->mImporter.end())   {
        pimpl->mImporter.erase(it);
        ASSIMP_LOG_INFO("Unregistering custom importer: ");
        return AI_SUCCESS;
    }
    ASSIMP_LOG_WARN("Unable to remove custom importer: I can't find you ...");
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_FAILURE;
}